

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
write(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      *this,int __fd,void *__buf,size_t __n)

{
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *extraout_RAX;
  buffer_appender<char> bVar1;
  char *s;
  basic_string_view<char> local_28;
  undefined1 local_11;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *paStack_10;
  bool value_local;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *this_local;
  
  local_11 = (byte)__fd & 1;
  paStack_10 = this;
  if (this->specs_ == (format_specs *)0x0) {
    bVar1 = write<char,fmt::v7::detail::buffer_appender<char>>
                      ((buffer_appender<char>)
                       (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                       container,(bool)local_11);
    (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (buffer<char> *)bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  }
  else {
    s = "false";
    if ((__fd & 1U) != 0) {
      s = "true";
    }
    basic_string_view<char>::basic_string_view(&local_28,s);
    write<char>(this,local_28,this->specs_);
    this = extraout_RAX;
  }
  return (ssize_t)this;
}

Assistant:

void write(bool value) {
    if (specs_)
      write(string_view(value ? "true" : "false"), *specs_);
    else
      out_ = detail::write<Char>(out_, value);
  }